

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int uv_fs_symlink(uv_loop_t *loop,uv_fs_t *req,char *path,char *new_path,int flags,uv_fs_cb cb)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  int iVar4;
  
  if (req == (uv_fs_t *)0x0) {
    iVar4 = -0x16;
  }
  else {
    req->type = UV_FS;
    req->fs_type = UV_FS_SYMLINK;
    req->result = 0;
    req->ptr = (void *)0x0;
    req->loop = loop;
    req->path = (char *)0x0;
    req->new_path = (char *)0x0;
    req->bufs = (uv_buf_t *)0x0;
    req->cb = cb;
    if (cb == (uv_fs_cb)0x0) {
      req->path = path;
      req->new_path = new_path;
      req->flags = flags;
      uv__fs_work(&req->work_req);
      iVar4 = (int)req->result;
    }
    else {
      sVar2 = strlen(path);
      sVar3 = strlen(new_path);
      __dest = (char *)uv__malloc(sVar3 + sVar2 + 2);
      req->path = __dest;
      if (__dest == (char *)0x0) {
        iVar4 = -0xc;
      }
      else {
        req->new_path = __dest + sVar2 + 1;
        memcpy(__dest,path,sVar2 + 1);
        memcpy(req->new_path,new_path,sVar3 + 1);
        req->flags = flags;
        iVar1 = uv__iou_fs_symlink(loop,req);
        iVar4 = 0;
        if (iVar1 == 0) {
          (loop->active_reqs).count = (loop->active_reqs).count + 1;
          uv__work_submit(loop,&req->work_req,UV__WORK_FAST_IO,uv__fs_work,uv__fs_done);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int uv_fs_symlink(uv_loop_t* loop,
                  uv_fs_t* req,
                  const char* path,
                  const char* new_path,
                  int flags,
                  uv_fs_cb cb) {
  INIT(SYMLINK);
  PATH2;
  req->flags = flags;
  if (cb != NULL)
    if (uv__iou_fs_symlink(loop, req))
      return 0;
  POST;
}